

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

Matrix33 *
AML::eulerAngleRatesMatrix_ZYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  undefined8 local_30;
  double local_28;
  double dStack_20;
  undefined8 local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  local_48 = sin(theta);
  dStack_20 = 1.0 / local_48;
  local_58 = dVar3 * dVar1 * dStack_20;
  dStack_50 = dVar3 * -dVar2 * dStack_20;
  local_40 = local_48 * dVar2 * dStack_20;
  dStack_38 = local_48 * dVar1 * dStack_20;
  local_30 = 0;
  local_28 = -dVar1 * dStack_20;
  dStack_20 = dVar2 * dStack_20;
  local_18 = 0;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_ZYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cscTheta = 1.0 / sinTheta;

        double data[3][3] = { { cosPhi * cosTheta * cscTheta, -sinPhi * cosTheta * cscTheta, sinTheta },
                              { sinPhi * sinTheta * cscTheta, cosPhi * sinTheta * cscTheta, 0.0 },
                              { -cosPhi * cscTheta, sinPhi * cscTheta, 0.0 } };

        return Matrix33(data);
    }